

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimRelPrint(Gia_Man_t *p,Vec_Wrd_t *vRel,Vec_Int_t *vOutMints)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  word *pwVar6;
  uint local_34;
  int local_30;
  int Count;
  int m;
  int i;
  int nMints;
  int nWords;
  Vec_Int_t *vOutMints_local;
  Vec_Wrd_t *vRel_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(p->vSimsPi);
  iVar2 = Gia_ManCiNum(p);
  iVar3 = Vec_WrdSize(vRel);
  iVar3 = iVar3 / (iVar1 / iVar2);
  for (Count = 0; Count < (iVar1 / iVar2) * 0x40; Count = Count + 1) {
    local_34 = 0;
    for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
      pwVar6 = Vec_WrdArray(vRel);
      uVar4 = Abc_TtGetBit(pwVar6,Count * iVar3 + local_30);
      printf("%d",(ulong)uVar4);
      pwVar6 = Vec_WrdArray(vRel);
      iVar5 = Abc_TtGetBit(pwVar6,Count * iVar3 + local_30);
      local_34 = iVar5 + local_34;
    }
    printf("  Count = %2d \n",(ulong)local_34);
  }
  return;
}

Assistant:

void Gia_ManSimRelPrint( Gia_Man_t * p, Vec_Wrd_t * vRel, Vec_Int_t * vOutMints )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = Vec_WrdSize(vRel) / nWords; 
    int i, m, Count;
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        int k;
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            printf( "%d", Abc_TtGetBit( Vec_WrdEntryP(p->vSimsPi, k), i ) );
        printf( " " );
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d ", Count );
        if ( vOutMints )
        {
            printf( "   %3d ", Vec_IntEntry(vOutMints, i) );
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+Vec_IntEntry(vOutMints, i) ) )
                printf( "yes" );
            else
                printf( "no" );
        }
        printf( "\n" );
    }
*/
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        printf( "%d ", Count );
    }
    printf( "\n" );
*/
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d \n", Count );
    }
}